

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  byte *pbVar8;
  byte *pbVar9;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(ushort *)&__return_storage_ptr__->field_2 = CONCAT11(stringQuote,stringQuote);
    __return_storage_ptr__->_M_string_length = 2;
    (__return_storage_ptr__->field_2)._M_local_buf[2] = '\0';
    return __return_storage_ptr__;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (arg,"true");
  if ((((iVar3 == 0) ||
       (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(arg,"false"), iVar3 == 0)) ||
      (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(arg,"nan"), iVar3 == 0)) ||
     (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(arg,"inf"), iVar3 == 0)) {
LAB_0018eff4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pbVar8 = (byte *)(arg->_M_dataplus)._M_p;
    pbVar9 = pbVar8 + arg->_M_string_length;
    goto LAB_0018f008;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (arg,0,2,"0x");
  if ((iVar3 != 0) &&
     (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(arg,0,2,"0X"), iVar3 != 0)) {
    local_90._M_dataplus._M_p = (pointer)0x0;
    bVar2 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,(double *)&local_90);
    if ((bVar2) &&
       (sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find_first_not_of(arg,"0123456789.-+eE",0,0xf), sVar4 == 0xffffffffffffffff))
    goto LAB_0018eff4;
  }
  pbVar8 = (byte *)(arg->_M_dataplus)._M_p;
  sVar4 = arg->_M_string_length;
  if (sVar4 == 1) {
    iVar3 = isprint((uint)*pbVar8);
    if (iVar3 == 0) goto LAB_0018f113;
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (arg,"\'");
    if (iVar3 == 0) {
      local_70._M_string_length = 1;
      local_70.field_2._M_local_buf[1] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70.field_2._M_local_buf[0] = stringQuote;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_70,"\'");
      local_90._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar7) {
        local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      ::std::operator+(__return_storage_ptr__,&local_90,stringQuote);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0018f2f0;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 1;
    local_70.field_2._M_local_buf[1] = '\0';
    local_70.field_2._M_local_buf[0] = literalQuote;
    ::std::operator+(&local_90,&local_70,arg);
    ::std::operator+(__return_storage_ptr__,&local_90,literalQuote);
    goto LAB_0018f272;
  }
  if (*pbVar8 == 0x30) {
    bVar1 = pbVar8[1];
    if (bVar1 == 0x62) {
      _Var5 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>>
                        (pbVar8 + 2,pbVar8 + sVar4);
    }
    else if (bVar1 == 0x6f) {
      _Var5 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>>
                        (pbVar8 + 2,pbVar8 + sVar4);
    }
    else {
      if (bVar1 != 0x78) goto LAB_0018f100;
      _Var5 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>>
                        (pbVar8 + 2,pbVar8 + sVar4);
    }
    pbVar9 = pbVar8 + sVar4;
    pbVar8 = (byte *)(arg->_M_dataplus)._M_p;
    sVar4 = arg->_M_string_length;
    if ((byte *)_Var5._M_current == pbVar9) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pbVar9 = pbVar8 + sVar4;
LAB_0018f008:
      ::std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pbVar8,pbVar9);
      return __return_storage_ptr__;
    }
  }
LAB_0018f100:
  _Var5 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::is_printable(std::__cxx11::string_const&)::_lambda(char)_1_>>
                    (pbVar8,pbVar8 + sVar4);
  if ((byte *)_Var5._M_current != pbVar8 + sVar4) {
LAB_0018f113:
    binary_escape_string(__return_storage_ptr__,arg);
    return __return_storage_ptr__;
  }
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_of(arg,escapedChars_abi_cxx11_,0,DAT_0056b4b8);
  if (sVar4 == 0xffffffffffffffff) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 1;
    local_70.field_2._M_local_buf[1] = '\0';
    local_70.field_2._M_local_buf[0] = stringQuote;
    ::std::operator+(&local_90,&local_70,arg);
    ::std::operator+(__return_storage_ptr__,&local_90,stringQuote);
LAB_0018f272:
    local_50.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_0018f285:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (100 < arg->_M_string_length && !disable_multi_line) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'\'\'","");
      ::std::operator+(&local_90,&local_70,arg);
      ::std::operator+(__return_storage_ptr__,&local_90,"\'\'\'");
      goto LAB_0018f272;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 1;
    local_70.field_2._M_local_buf[1] = '\0';
    local_70.field_2._M_local_buf[0] = stringQuote;
    add_escaped_characters(&local_50,arg);
    ::std::operator+(&local_90,&local_70,&local_50);
    ::std::operator+(__return_storage_ptr__,&local_90,stringQuote);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0018f285;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return __return_storage_ptr__;
  }
LAB_0018f2f0:
  operator_delete(local_70._M_dataplus._M_p,
                  CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,
                           CONCAT11(local_70.field_2._M_local_buf[1],
                                    local_70.field_2._M_local_buf[0])) + 1);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}